

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,Path *v)

{
  Path *in_RDX;
  string local_30;
  
  tinyusdz::(anonymous_namespace)::pquote_abi_cxx11_(&local_30,(_anonymous_namespace_ *)v,in_RDX);
  std::operator<<(ofs,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Path &v) {
  ofs << tinyusdz::pquote(v);

  return ofs;
}